

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argtable3.c
# Opt level: O2

char * arg_strptime(char *buf,char *fmt,tm *tm)

{
  byte *pbVar1;
  ushort *puVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  undefined1 auVar7 [4];
  ushort **ppuVar8;
  size_t n;
  int llim;
  byte *pbVar9;
  char *pcVar10;
  tm *ptVar11;
  long lVar12;
  byte bVar13;
  long lVar14;
  undefined1 local_6c [4];
  byte *local_68;
  tm *local_60;
  int local_54;
  tm *local_50;
  tm *local_48;
  tm *local_40;
  tm *local_38;
  
  local_48 = (tm *)&tm->tm_wday;
  local_50 = (tm *)&tm->tm_hour;
  local_40 = (tm *)&tm->tm_min;
  local_38 = (tm *)&tm->tm_mday;
  local_54 = 0;
  local_68 = (byte *)buf;
  local_60 = tm;
LAB_0012e576:
  pbVar9 = (byte *)fmt + 2;
  while( true ) {
    pbVar1 = local_68;
    bVar13 = *fmt;
    if ((long)(char)bVar13 == 0) {
      return (char *)local_68;
    }
    ppuVar8 = __ctype_b_loc();
    ptVar11 = local_50;
    puVar2 = *ppuVar8;
    if ((*(byte *)((long)puVar2 + (long)(char)bVar13 * 2 + 1) & 0x20) == 0) break;
    local_68 = pbVar1 + -1;
    do {
      pbVar1 = local_68 + 1;
      local_68 = local_68 + 1;
    } while ((*(byte *)((long)puVar2 + (long)(char)*pbVar1 * 2 + 1) & 0x20) != 0);
    fmt = (char *)((byte *)fmt + 1);
    pbVar9 = pbVar9 + 1;
  }
  if (bVar13 != 0x25) {
    pbVar9 = (byte *)fmt + 1;
switchD_0012e5ee_caseD_25:
    local_68 = pbVar1 + 1;
    fmt = (char *)pbVar9;
    if (bVar13 != *pbVar1) {
      return (char *)0x0;
    }
    goto LAB_0012e576;
  }
  bVar3 = true;
  bVar5 = true;
  bVar4 = true;
LAB_0012e5c6:
  bVar13 = pbVar9[-1];
  fmt = (char *)pbVar9;
  switch(bVar13) {
  case 0x25:
    goto switchD_0012e5ee_caseD_25;
  default:
    goto switchD_0012e5ee_caseD_26;
  case 0x41:
  case 0x61:
    if (!bVar3) {
      return (char *)0x0;
    }
    lVar14 = 0;
    lVar12 = 0;
    goto LAB_0012e71c;
  case 0x42:
  case 0x62:
  case 0x68:
    if (!bVar3) {
      return (char *)0x0;
    }
    lVar14 = 0;
    lVar12 = 0;
    goto LAB_0012e647;
  case 0x43:
    if (!bVar5) {
      return (char *)0x0;
    }
    iVar6 = conv_num((char **)&local_68,(int *)local_6c,0,99);
    if (iVar6 == 0) {
      return (char *)0x0;
    }
    if (local_54 == 0) {
      auVar7 = (undefined1  [4])((int)local_6c * 100);
    }
    else {
      auVar7 = (undefined1  [4])((int)local_6c * 100 + local_60->tm_year % 100);
    }
LAB_0012ead4:
    local_60->tm_year = (int)auVar7;
    goto LAB_0012ead7;
  case 0x44:
    if (!bVar3) {
      return (char *)0x0;
    }
    goto LAB_0012ea35;
  case 0x45:
    bVar4 = false;
    if (!bVar3) {
      return (char *)0x0;
    }
    bVar5 = true;
    goto LAB_0012e60e;
  case 0x48:
    if (!bVar4) {
      return (char *)0x0;
    }
    goto LAB_0012ea47;
  case 0x49:
    if (!bVar4) {
      return (char *)0x0;
    }
    goto LAB_0012e88a;
  case 0x4d:
    if (!bVar4) {
      return (char *)0x0;
    }
    iVar6 = 0x3b;
    ptVar11 = local_40;
    goto LAB_0012ea54;
  case 0x4f:
    bVar5 = false;
    if (!bVar3) {
      return (char *)0x0;
    }
    bVar4 = true;
LAB_0012e60e:
    pbVar9 = pbVar9 + 1;
    bVar3 = false;
    goto LAB_0012e5c6;
  case 0x52:
    if (!bVar3) {
      return (char *)0x0;
    }
    pcVar10 = "%H:%M";
    break;
  case 0x53:
    if (!bVar4) {
      return (char *)0x0;
    }
    iVar6 = 0x3d;
    ptVar11 = local_60;
    goto LAB_0012ea54;
  case 0x54:
    if (!bVar3) {
      return (char *)0x0;
    }
    goto LAB_0012ea80;
  case 0x55:
  case 0x57:
    if (!bVar4) {
      return (char *)0x0;
    }
    ptVar11 = (tm *)local_6c;
    iVar6 = 0x35;
    goto LAB_0012ea54;
  case 0x58:
    if (!bVar5) {
      return (char *)0x0;
    }
LAB_0012ea80:
    pcVar10 = "%H:%M:%S";
    break;
  case 0x59:
    if (!bVar5) {
      return (char *)0x0;
    }
    iVar6 = conv_num((char **)&local_68,(int *)local_6c,0,9999);
    if (iVar6 == 0) {
      return (char *)0x0;
    }
    local_60->tm_year = (int)local_6c + -0x76c;
    goto LAB_0012e576;
  case 99:
    if (!bVar5) {
      return (char *)0x0;
    }
    pcVar10 = "%x %X";
    break;
  case 100:
  case 0x65:
    if (!bVar4) {
      return (char *)0x0;
    }
    llim = 1;
    iVar6 = 0x1f;
    ptVar11 = local_38;
    goto LAB_0012ea56;
  case 0x6a:
    if (!bVar3) {
      return (char *)0x0;
    }
    iVar6 = conv_num((char **)&local_68,(int *)local_6c,1,0x16e);
    if (iVar6 == 0) {
      return (char *)0x0;
    }
    local_60->tm_yday = (int)local_6c + -1;
    goto LAB_0012e576;
  case 0x6b:
    if (!(bool)(bVar3 & bVar4)) {
      return (char *)0x0;
    }
LAB_0012ea47:
    iVar6 = 0x17;
    goto LAB_0012ea54;
  case 0x6c:
    if (!(bool)(bVar3 & bVar4)) {
      return (char *)0x0;
    }
LAB_0012e88a:
    iVar6 = conv_num((char **)&local_68,&local_50->tm_sec,1,0xc);
    if (iVar6 == 0) {
      return (char *)0x0;
    }
    if (ptVar11->tm_sec == 0xc) {
      ptVar11->tm_sec = 0;
    }
    goto LAB_0012e576;
  case 0x6d:
    if (!bVar4) {
      return (char *)0x0;
    }
    iVar6 = conv_num((char **)&local_68,(int *)local_6c,1,0xc);
    if (iVar6 == 0) {
      return (char *)0x0;
    }
    local_60->tm_mon = (int)local_6c + -1;
    goto LAB_0012e576;
  case 0x6e:
  case 0x74:
    if (!bVar3) {
      return (char *)0x0;
    }
    local_68 = pbVar1 + -1;
    do {
      pbVar9 = local_68 + 1;
      local_68 = local_68 + 1;
    } while ((*(byte *)((long)puVar2 + (long)(char)*pbVar9 * 2 + 1) & 0x20) != 0);
    goto LAB_0012e576;
  case 0x70:
    if (!bVar3) {
      return (char *)0x0;
    }
    iVar6 = arg_strcasecmp("AM",(char *)pbVar1);
    if (iVar6 == 0) {
      if (0xb < local_50->tm_sec) {
        return (char *)0x0;
      }
    }
    else {
      iVar6 = arg_strcasecmp("PM",(char *)pbVar1);
      if (iVar6 != 0) {
        return (char *)0x0;
      }
      if (0xb < local_50->tm_sec) {
        return (char *)0x0;
      }
      local_50->tm_sec = local_50->tm_sec + 0xc;
    }
    local_68 = pbVar1 + 2;
    goto LAB_0012e576;
  case 0x72:
    if (!bVar3) {
      return (char *)0x0;
    }
    pcVar10 = "%I:%M:%S %p";
    break;
  case 0x77:
    goto switchD_0012e5ee_caseD_77;
  case 0x78:
    if (!bVar5) {
      return (char *)0x0;
    }
LAB_0012ea35:
    pcVar10 = "%m/%d/%y";
    break;
  case 0x79:
    iVar6 = conv_num((char **)&local_68,(int *)local_6c,0,99);
    if (iVar6 == 0) {
      return (char *)0x0;
    }
    if (local_54 == 0) {
      auVar7 = local_6c;
      if ((int)local_6c < 0x45) {
        auVar7 = (undefined1  [4])((int)local_6c + 100);
      }
      goto LAB_0012ead4;
    }
    local_60->tm_year = (local_60->tm_year + (int)local_6c) - local_60->tm_year % 100;
LAB_0012ead7:
    local_54 = 1;
    goto LAB_0012e576;
  }
  local_68 = (byte *)arg_strptime((char *)pbVar1,pcVar10,local_60);
  if (local_68 == (byte *)0x0) {
    return (char *)0x0;
  }
  goto LAB_0012e576;
switchD_0012e5ee_caseD_77:
  if (!bVar4) {
    return (char *)0x0;
  }
  iVar6 = 6;
  ptVar11 = local_48;
LAB_0012ea54:
  llim = 0;
LAB_0012ea56:
  iVar6 = conv_num((char **)&local_68,&ptVar11->tm_sec,llim,iVar6);
  if (iVar6 == 0) {
    return (char *)0x0;
  }
  goto LAB_0012e576;
LAB_0012e647:
  if (lVar12 == 0xc) {
    return (char *)0x0;
  }
  pcVar10 = *(char **)((long)mon + lVar14);
  n = strlen(pcVar10);
  iVar6 = arg_strncasecmp(pcVar10,(char *)pbVar1,n);
  if (iVar6 == 0) goto LAB_0012e77f;
  pcVar10 = *(char **)((long)abmon + lVar14);
  n = strlen(pcVar10);
  iVar6 = arg_strncasecmp(pcVar10,(char *)pbVar1,n);
  if (iVar6 == 0) goto LAB_0012e77f;
  lVar12 = lVar12 + 1;
  lVar14 = lVar14 + 8;
  goto LAB_0012e647;
LAB_0012e77f:
  local_6c = SUB84(lVar12,0);
  local_60->tm_mon = (int)local_6c;
  goto LAB_0012e79c;
LAB_0012e71c:
  if (lVar12 == 7) {
switchD_0012e5ee_caseD_26:
    return (char *)0x0;
  }
  pcVar10 = *(char **)((long)day + lVar14);
  n = strlen(pcVar10);
  iVar6 = arg_strncasecmp(pcVar10,(char *)pbVar1,n);
  if (iVar6 == 0) goto LAB_0012e78f;
  pcVar10 = *(char **)((long)abday + lVar14);
  n = strlen(pcVar10);
  iVar6 = arg_strncasecmp(pcVar10,(char *)pbVar1,n);
  if (iVar6 == 0) goto LAB_0012e78f;
  lVar12 = lVar12 + 1;
  lVar14 = lVar14 + 8;
  goto LAB_0012e71c;
LAB_0012e78f:
  local_6c = SUB84(lVar12,0);
  local_48->tm_sec = (int)local_6c;
LAB_0012e79c:
  local_68 = pbVar1 + n;
  goto LAB_0012e576;
}

Assistant:

char* arg_strptime(const char* buf, const char* fmt, struct tm* tm) {
    char c;
    const char* bp;
    size_t len = 0;
    int alt_format, i, split_year = 0;

    bp = buf;

    while ((c = *fmt) != '\0') {
        /* Clear `alternate' modifier prior to new conversion. */
        alt_format = 0;

        /* Eat up white-space. */
        if (isspace(c)) {
            while (isspace((int)(*bp)))
                bp++;

            fmt++;
            continue;
        }

        if ((c = *fmt++) != '%')
            goto literal;

    again:
        switch (c = *fmt++) {
            case '%': /* "%%" is converted to "%". */
            literal:
                if (c != *bp++)
                    return (0);
                break;

            /*
             * "Alternative" modifiers. Just set the appropriate flag
             * and start over again.
             */
            case 'E': /* "%E?" alternative conversion modifier. */
                LEGAL_ALT(0);
                alt_format |= ALT_E;
                goto again;

            case 'O': /* "%O?" alternative conversion modifier. */
                LEGAL_ALT(0);
                alt_format |= ALT_O;
                goto again;

            /*
             * "Complex" conversion rules, implemented through recursion.
             */
            case 'c': /* Date and time, using the locale's format. */
                LEGAL_ALT(ALT_E);
                bp = arg_strptime(bp, "%x %X", tm);
                if (!bp)
                    return (0);
                break;

            case 'D': /* The date as "%m/%d/%y". */
                LEGAL_ALT(0);
                bp = arg_strptime(bp, "%m/%d/%y", tm);
                if (!bp)
                    return (0);
                break;

            case 'R': /* The time as "%H:%M". */
                LEGAL_ALT(0);
                bp = arg_strptime(bp, "%H:%M", tm);
                if (!bp)
                    return (0);
                break;

            case 'r': /* The time in 12-hour clock representation. */
                LEGAL_ALT(0);
                bp = arg_strptime(bp, "%I:%M:%S %p", tm);
                if (!bp)
                    return (0);
                break;

            case 'T': /* The time as "%H:%M:%S". */
                LEGAL_ALT(0);
                bp = arg_strptime(bp, "%H:%M:%S", tm);
                if (!bp)
                    return (0);
                break;

            case 'X': /* The time, using the locale's format. */
                LEGAL_ALT(ALT_E);
                bp = arg_strptime(bp, "%H:%M:%S", tm);
                if (!bp)
                    return (0);
                break;

            case 'x': /* The date, using the locale's format. */
                LEGAL_ALT(ALT_E);
                bp = arg_strptime(bp, "%m/%d/%y", tm);
                if (!bp)
                    return (0);
                break;

            /*
             * "Elementary" conversion rules.
             */
            case 'A': /* The day of week, using the locale's form. */
            case 'a':
                LEGAL_ALT(0);
                for (i = 0; i < 7; i++) {
                    /* Full name. */
                    len = strlen(day[i]);
                    if (arg_strncasecmp(day[i], bp, len) == 0)
                        break;

                    /* Abbreviated name. */
                    len = strlen(abday[i]);
                    if (arg_strncasecmp(abday[i], bp, len) == 0)
                        break;
                }

                /* Nothing matched. */
                if (i == 7)
                    return (0);

                tm->tm_wday = i;
                bp += len;
                break;

            case 'B': /* The month, using the locale's form. */
            case 'b':
            case 'h':
                LEGAL_ALT(0);
                for (i = 0; i < 12; i++) {
                    /* Full name. */
                    len = strlen(mon[i]);
                    if (arg_strncasecmp(mon[i], bp, len) == 0)
                        break;

                    /* Abbreviated name. */
                    len = strlen(abmon[i]);
                    if (arg_strncasecmp(abmon[i], bp, len) == 0)
                        break;
                }

                /* Nothing matched. */
                if (i == 12)
                    return (0);

                tm->tm_mon = i;
                bp += len;
                break;

            case 'C': /* The century number. */
                LEGAL_ALT(ALT_E);
                if (!(conv_num(&bp, &i, 0, 99)))
                    return (0);

                if (split_year) {
                    tm->tm_year = (tm->tm_year % 100) + (i * 100);
                } else {
                    tm->tm_year = i * 100;
                    split_year = 1;
                }
                break;

            case 'd': /* The day of month. */
            case 'e':
                LEGAL_ALT(ALT_O);
                if (!(conv_num(&bp, &tm->tm_mday, 1, 31)))
                    return (0);
                break;

            case 'k': /* The hour (24-hour clock representation). */
                LEGAL_ALT(0);
            /* FALLTHROUGH */
            case 'H':
                LEGAL_ALT(ALT_O);
                if (!(conv_num(&bp, &tm->tm_hour, 0, 23)))
                    return (0);
                break;

            case 'l': /* The hour (12-hour clock representation). */
                LEGAL_ALT(0);
            /* FALLTHROUGH */
            case 'I':
                LEGAL_ALT(ALT_O);
                if (!(conv_num(&bp, &tm->tm_hour, 1, 12)))
                    return (0);
                if (tm->tm_hour == 12)
                    tm->tm_hour = 0;
                break;

            case 'j': /* The day of year. */
                LEGAL_ALT(0);
                if (!(conv_num(&bp, &i, 1, 366)))
                    return (0);
                tm->tm_yday = i - 1;
                break;

            case 'M': /* The minute. */
                LEGAL_ALT(ALT_O);
                if (!(conv_num(&bp, &tm->tm_min, 0, 59)))
                    return (0);
                break;

            case 'm': /* The month. */
                LEGAL_ALT(ALT_O);
                if (!(conv_num(&bp, &i, 1, 12)))
                    return (0);
                tm->tm_mon = i - 1;
                break;

            case 'p': /* The locale's equivalent of AM/PM. */
                LEGAL_ALT(0);
                /* AM? */
                if (arg_strcasecmp(am_pm[0], bp) == 0) {
                    if (tm->tm_hour > 11)
                        return (0);

                    bp += strlen(am_pm[0]);
                    break;
                }
                /* PM? */
                else if (arg_strcasecmp(am_pm[1], bp) == 0) {
                    if (tm->tm_hour > 11)
                        return (0);

                    tm->tm_hour += 12;
                    bp += strlen(am_pm[1]);
                    break;
                }

                /* Nothing matched. */
                return (0);

            case 'S': /* The seconds. */
                LEGAL_ALT(ALT_O);
                if (!(conv_num(&bp, &tm->tm_sec, 0, 61)))
                    return (0);
                break;

            case 'U': /* The week of year, beginning on sunday. */
            case 'W': /* The week of year, beginning on monday. */
                LEGAL_ALT(ALT_O);
                /*
                 * XXX This is bogus, as we can not assume any valid
                 * information present in the tm structure at this
                 * point to calculate a real value, so just check the
                 * range for now.
                 */
                if (!(conv_num(&bp, &i, 0, 53)))
                    return (0);
                break;

            case 'w': /* The day of week, beginning on sunday. */
                LEGAL_ALT(ALT_O);
                if (!(conv_num(&bp, &tm->tm_wday, 0, 6)))
                    return (0);
                break;

            case 'Y': /* The year. */
                LEGAL_ALT(ALT_E);
                if (!(conv_num(&bp, &i, 0, 9999)))
                    return (0);

                tm->tm_year = i - TM_YEAR_BASE;
                break;

            case 'y': /* The year within 100 years of the epoch. */
                LEGAL_ALT(ALT_E | ALT_O);
                if (!(conv_num(&bp, &i, 0, 99)))
                    return (0);

                if (split_year) {
                    tm->tm_year = ((tm->tm_year / 100) * 100) + i;
                    break;
                }
                split_year = 1;
                if (i <= 68)
                    tm->tm_year = i + 2000 - TM_YEAR_BASE;
                else
                    tm->tm_year = i + 1900 - TM_YEAR_BASE;
                break;

            /*
             * Miscellaneous conversions.
             */
            case 'n': /* Any kind of white-space. */
            case 't':
                LEGAL_ALT(0);
                while (isspace((int)(*bp)))
                    bp++;
                break;

            default: /* Unknown/unsupported conversion. */
                return (0);
        }
    }

    /* LINTED functional specification */
    return ((char*)bp);
}